

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

bool __thiscall
ByteCodeGenerator::CanStackNestedFunc(ByteCodeGenerator *this,FuncInfo *funcInfo,bool trace)

{
  NestedArray *pNVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  LocalFunctionId LVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  char16 *pcVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char16_t *form;
  ParseableFunctionInfo *this_00;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  undefined8 uVar8;
  
  bVar3 = FuncInfo::IsGlobalFunction(funcInfo);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x754,"(!funcInfo->IsGlobalFunction())","!funcInfo->IsGlobalFunction()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  if ((funcInfo->field_0xb5 & 0x20) != 0) {
    return false;
  }
  bVar3 = IsInDebugMode(this);
  if (bVar3) {
    return false;
  }
  bVar3 = Js::FunctionProxy::IsCoroutine(&funcInfo->byteCodeFunction->super_FunctionProxy);
  if (bVar3) {
    return false;
  }
  bVar3 = Js::FunctionProxy::IsModule(&funcInfo->byteCodeFunction->super_FunctionProxy);
  if (bVar3) {
    return false;
  }
  bVar3 = Js::ScriptContext::ExceedsStackNestedFuncCount(funcInfo->root->nestedCount);
  if (bVar3) {
    return false;
  }
  if ((*(uint *)&funcInfo->field_0xb4 & 6) == 0) {
    if ((((funcInfo->bodyScope->field_0x44 & 2) == 0) &&
        ((funcInfo->paramScope->field_0x44 & 2) == 0)) &&
       ((funcInfo->funcExprScope == (Scope *)0x0 || ((funcInfo->funcExprScope->field_0x44 & 2) == 0)
        ))) {
      if ((short)*(uint *)&funcInfo->field_0xb4 < 0) {
        this_00 = funcInfo->byteCodeFunction;
        if (((trace) && (pNVar1 = (this_00->nestedArray).ptr, pNVar1 != (NestedArray *)0x0)) &&
           (pNVar1->nestedCount != 0)) {
          uVar4 = Js::FunctionProxy::GetSourceContextId(&this_00->super_FunctionProxy);
          LVar5 = Js::FunctionProxy::GetLocalFunctionId
                            (&funcInfo->byteCodeFunction->super_FunctionProxy);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,StackFuncPhase,uVar4,LVar5);
          this_00 = funcInfo->byteCodeFunction;
          if (bVar3) {
            iVar6 = (*(this_00->super_FunctionProxy).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
            pcVar9 = Js::FunctionProxy::GetDebugNumberSet
                               (&funcInfo->byteCodeFunction->super_FunctionProxy,
                                (wchar (*) [42])local_88);
            Output::Print(L"DoStackNestedFunc: %s (function %s)\n",CONCAT44(extraout_var_02,iVar6),
                          pcVar9);
            Output::Flush();
            this_00 = funcInfo->byteCodeFunction;
          }
        }
        uVar4 = Js::FunctionProxy::GetSourceContextId(&this_00->super_FunctionProxy);
        LVar5 = Js::FunctionProxy::GetLocalFunctionId
                          (&funcInfo->byteCodeFunction->super_FunctionProxy);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,StackFuncPhase,uVar4,LVar5);
        return !bVar3;
      }
      if (!trace) {
        return false;
      }
      uVar4 = Js::FunctionProxy::GetSourceContextId
                        (&funcInfo->byteCodeFunction->super_FunctionProxy);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId
                        (&funcInfo->byteCodeFunction->super_FunctionProxy);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,StackFuncPhase,uVar4,LVar5);
      if (!bVar3) {
        return false;
      }
      iVar6 = (*(funcInfo->byteCodeFunction->super_FunctionProxy).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      Output::Print(L"CanStackNestedFunc: %s (Split Scope)\n",CONCAT44(extraout_var_00,iVar6));
      goto LAB_0077c45f;
    }
    if (!trace) {
      return false;
    }
    uVar4 = Js::FunctionProxy::GetSourceContextId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,StackFuncPhase,uVar4,LVar5);
    if (!bVar3) {
      return false;
    }
    iVar6 = (*(funcInfo->byteCodeFunction->super_FunctionProxy).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar8 = CONCAT44(extraout_var_01,iVar6);
    pcVar9 = Js::FunctionProxy::GetDebugNumberSet
                       (&funcInfo->byteCodeFunction->super_FunctionProxy,(wchar (*) [42])local_88);
    form = L"HasMaybeEscapedNestedFunc (ObjectScope): %s (function %s)\n";
  }
  else {
    if (!trace) {
      return false;
    }
    uVar4 = Js::FunctionProxy::GetSourceContextId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,StackFuncPhase,uVar4,LVar5);
    if (!bVar3) {
      return false;
    }
    iVar6 = (*(funcInfo->byteCodeFunction->super_FunctionProxy).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar8 = CONCAT44(extraout_var,iVar6);
    pcVar9 = Js::FunctionProxy::GetDebugNumberSet
                       (&funcInfo->byteCodeFunction->super_FunctionProxy,(wchar (*) [42])local_88);
    form = L"HasMaybeEscapedNestedFunc (Eval): %s (function %s)\n";
  }
  Output::Print(form,uVar8,pcVar9);
LAB_0077c45f:
  Output::Flush();
  return false;
}

Assistant:

bool ByteCodeGenerator::CanStackNestedFunc(FuncInfo * funcInfo, bool trace)
{
#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    Assert(!funcInfo->IsGlobalFunction());
    bool const doStackNestedFunc = !funcInfo->HasMaybeEscapedNestedFunc() && !IsInDebugMode()
        && !funcInfo->byteCodeFunction->IsCoroutine()
        && !funcInfo->byteCodeFunction->IsModule()
        && !Js::ScriptContext::ExceedsStackNestedFuncCount(funcInfo->root->nestedCount);
    if (!doStackNestedFunc)
    {
        return false;
    }

    bool callsEval = funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval();
    if (callsEval)
    {
        if (trace)
        {
            PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
                _u("HasMaybeEscapedNestedFunc (Eval): %s (function %s)\n"),
                funcInfo->byteCodeFunction->GetDisplayName(),
                funcInfo->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
        }
        return false;
    }

    if (funcInfo->GetBodyScope()->GetIsObject() || funcInfo->GetParamScope()->GetIsObject() || (funcInfo->GetFuncExprScope() && funcInfo->GetFuncExprScope()->GetIsObject()))
    {
        if (trace)
        {
            PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
                _u("HasMaybeEscapedNestedFunc (ObjectScope): %s (function %s)\n"),
                funcInfo->byteCodeFunction->GetDisplayName(),
                funcInfo->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
        }
        return false;
    }

    if (!funcInfo->IsBodyAndParamScopeMerged())
    {
        if (trace)
        {
            PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
                _u("CanStackNestedFunc: %s (Split Scope)\n"),
                funcInfo->byteCodeFunction->GetDisplayName());
        }
        return false;
    }

    if (trace && funcInfo->byteCodeFunction->GetNestedCount())
    {
        // Only print functions that actually have nested functions, although we will still mark
        // functions that don't have nested child functions as DoStackNestedFunc.
        PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
            _u("DoStackNestedFunc: %s (function %s)\n"),
            funcInfo->byteCodeFunction->GetDisplayName(),
            funcInfo->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
    }

    return !PHASE_OFF(Js::StackFuncPhase, funcInfo->byteCodeFunction);
}